

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O3

void __thiscall features::free_space_names(features *this,size_t i)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar1;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar2;
  ulong uVar3;
  
  psVar1 = (this->space_names)._begin;
  psVar2 = (this->space_names)._end;
  if (i < (ulong)((long)psVar2 - (long)psVar1 >> 4)) {
    uVar3 = i << 4 | 8;
    do {
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)&(psVar1->
                         super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr + uVar3);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        psVar1 = (this->space_names)._begin;
        psVar2 = (this->space_names)._end;
      }
      i = i + 1;
      uVar3 = uVar3 + 0x10;
    } while (i < (ulong)((long)psVar2 - (long)psVar1 >> 4));
  }
  return;
}

Assistant:

inline size_t size() const { return _end - _begin; }